

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset,size_t looper)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  rar_filter *prVar7;
  void *pvVar8;
  undefined4 extraout_var;
  void *pvVar9;
  size_t sVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  char *fmt;
  uint uVar16;
  ulong length;
  ulong uVar17;
  uint32_t uVar18;
  uint uVar19;
  rar_filter *filter;
  uint32_t uVar20;
  uint uVar21;
  int64_t end;
  long local_60;
  ulong local_58;
  size_t local_50;
  rar_br *local_48;
  ulong local_40;
  ssize_t *local_38;
  
  iVar3 = -0x1e;
  if (looper < 0x401) {
    pvVar1 = a->format->data;
    if (*(char *)((long)pvVar1 + 0xd0) != '\0') {
      local_50 = looper + 1;
      local_48 = (rar_br *)((long)pvVar1 + 0x4f30);
      local_38 = (ssize_t *)((long)pvVar1 + 0x4f40);
      p = (CPpmd7 *)((long)pvVar1 + 0x3d8);
      rc = (IPpmd7_RangeDec *)((long)pvVar1 + 0x4ec8);
      uVar12 = 0;
      do {
        sVar10 = *(size_t *)((long)pvVar1 + 0x3c8);
        if (sVar10 != 0) {
          uVar6 = *(uint *)((long)pvVar1 + 0xd4);
          if ((ulong)uVar6 == 0) {
            pvVar8 = *(void **)((long)pvVar1 + 0x3c0);
            *buff = pvVar8;
            *size = sVar10;
            *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + sVar10;
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
            *(long *)((long)pvVar1 + 0x3c8) = *(long *)((long)pvVar1 + 0x3c8) - *size;
            *(size_t *)((long)pvVar1 + 0x3c0) = (long)pvVar8 + *size;
            pvVar8 = *buff;
          }
          else {
            pvVar8 = *(void **)((long)pvVar1 + 0xe0);
            *buff = pvVar8;
            *size = (ulong)uVar6;
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
LAB_0014198e:
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
          }
          uVar11 = crc32(*(undefined8 *)((long)pvVar1 + 0xf0),pvVar8,(int)*size);
          *(undefined8 *)((long)pvVar1 + 0xf0) = uVar11;
          goto LAB_00141a83;
        }
        if (*(char *)((long)pvVar1 + 0x3d1) != '\0') {
LAB_001418ad:
          uVar6 = *(uint *)((long)pvVar1 + 0xd4);
          if ((ulong)uVar6 != 0) {
            pvVar8 = *(void **)((long)pvVar1 + 0xe0);
            *buff = pvVar8;
            *size = (ulong)uVar6;
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
            uVar11 = crc32(*(undefined8 *)((long)pvVar1 + 0xf0),pvVar8,(int)*size);
            *(undefined8 *)((long)pvVar1 + 0xf0) = uVar11;
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
LAB_00141900:
            uVar12 = 0;
            goto LAB_00141a83;
          }
          *buff = (void *)0x0;
          *size = 0;
          *offset = *(int64_t *)((long)pvVar1 + 0xb8);
          if (*(long *)((long)pvVar1 + 8) == *(long *)((long)pvVar1 + 0xf0)) {
            *(undefined1 *)((long)pvVar1 + 0xed) = 1;
            uVar12 = 1;
            goto LAB_00141a83;
          }
          fmt = "File CRC error";
LAB_00141a72:
          archive_set_error(&a->archive,0x54,fmt);
          break;
        }
        if (*(int *)((long)pvVar1 + 0xe8) == 0) {
LAB_00141259:
          if (*(long *)((long)pvVar1 + 0x3b8) == *(long *)((long)pvVar1 + 0x3a8)) {
            pvVar8 = a->format->data;
            filter = *(rar_filter **)((long)pvVar8 + 0x3a0);
            if (filter == (rar_filter *)0x0) break;
            lVar15 = *(long *)((long)pvVar8 + 0x3a8);
            local_58 = (ulong)filter->blocklength + lVar15;
            *(undefined8 *)((long)pvVar8 + 0x3a8) = 0x7fffffffffffffff;
            local_40 = uVar12;
            iVar3 = expand(a,(int64_t *)&local_58);
            uVar12 = local_58;
            if (iVar3 != 0) break;
            prVar7 = *(rar_filter **)((long)pvVar8 + 0x3a0);
            while( true ) {
              if (prVar7 == (rar_filter *)0x0) goto LAB_00141a7e;
              if (prVar7 == filter) break;
              prVar7 = prVar7->next;
            }
            if (((long)local_58 < 0) ||
               (uVar6 = filter->blocklength, local_58 != lVar15 + (ulong)uVar6)) break;
            pvVar9 = *(void **)((long)pvVar8 + 0x390);
            if (pvVar9 == (void *)0x0) {
              pvVar9 = calloc(1,0x40024);
              *(void **)((long)pvVar8 + 0x390) = pvVar9;
              if (pvVar9 == (void *)0x0) break;
            }
            if (0x40000 < uVar6) {
              fmt = "Bad RAR file data";
              goto LAB_00141a72;
            }
            iVar3 = copy_from_lzss_window(a,(void *)((long)pvVar9 + 0x20),lVar15,uVar6);
            if ((iVar3 != 0) ||
               (iVar3 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar8 + 0x390),
                                       *(size_t *)((long)pvVar8 + 0xb8)), iVar3 == 0)) break;
            uVar18 = filter->filteredblockaddress;
            uVar20 = filter->filteredblocklength;
            *(rar_filter **)((long)pvVar8 + 0x3a0) = filter->next;
            filter->next = (rar_filter *)0x0;
            while( true ) {
              delete_filter(filter);
              filter = *(rar_filter **)((long)pvVar8 + 0x3a0);
              if (filter == (rar_filter *)0x0) break;
              uVar17 = filter->blockstartpos;
              if ((uVar17 != *(ulong *)((long)pvVar8 + 0x3a8)) || (filter->blocklength != uVar20)) {
                if (uVar17 < uVar12) goto LAB_00141a7e;
                *(ulong *)((long)pvVar8 + 0x3a8) = uVar17;
                break;
              }
              memmove((void *)(*(long *)((long)pvVar8 + 0x390) + 0x20),
                      (void *)(*(long *)((long)pvVar8 + 0x390) + (ulong)uVar18 + 0x20),(ulong)uVar20
                     );
              iVar3 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar8 + 0x390),
                                     *(size_t *)((long)pvVar8 + 0xb8));
              if (iVar3 == 0) goto LAB_00141a7e;
              uVar18 = filter->filteredblockaddress;
              uVar20 = filter->filteredblocklength;
              *(rar_filter **)((long)pvVar8 + 0x3a0) = filter->next;
              filter->next = (rar_filter *)0x0;
            }
            *(ulong *)((long)pvVar8 + 0x3b8) = uVar12;
            *(ulong *)((long)pvVar8 + 0x3c0) =
                 *(long *)((long)pvVar8 + 0x390) + (ulong)uVar18 + 0x20;
            *(ulong *)((long)pvVar8 + 0x3c8) = (ulong)uVar20;
            uVar12 = local_40;
          }
          else {
            if ((*(long *)((long)pvVar1 + 0x4f48) == 0) &&
               (uVar12 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
              pvVar8 = rar_read_ahead(a,1,local_38);
              *(void **)((long)pvVar1 + 0x4f48) = pvVar8;
              if (pvVar8 == (void *)0x0) {
                fmt = "Truncated RAR file data";
                goto LAB_00141a72;
              }
              if (*(int *)((long)pvVar1 + 0x4f38) == 0) {
                rar_br_fillup(a,local_48);
              }
              uVar12 = 0;
            }
            if (*(char *)((long)pvVar1 + 0x388) != '\0') {
              iVar3 = parse_codes(a);
              uVar12 = CONCAT44(extraout_var,iVar3);
              if (iVar3 < -0x14) goto LAB_00141a83;
            }
            if (*(char *)((long)pvVar1 + 0x3d2) == '\0') {
              lVar15 = *(long *)((long)pvVar1 + 0xb8);
              local_60 = lVar15 + -0x104;
              if ((ulong)*(uint *)((long)pvVar1 + 0xe8) < 0x105) {
                local_60 = lVar15;
              }
              local_60 = local_60 + (ulong)*(uint *)((long)pvVar1 + 0xe8);
              if (*(long *)((long)pvVar1 + 0x3a8) < local_60) {
                local_60 = *(long *)((long)pvVar1 + 0x3a8);
              }
              uVar6 = expand(a,&local_60);
              uVar12 = (ulong)uVar6;
              if (uVar6 != 0) goto LAB_00141a83;
              sVar10 = local_60 - lVar15;
              *(size_t *)((long)pvVar1 + 0xb0) = sVar10;
              *(long *)((long)pvVar1 + 0x3b8) = local_60;
              if (sVar10 == 0 && local_60 != *(long *)((long)pvVar1 + 0x3a8)) {
                fmt = "Internal error extracting RAR file";
                goto LAB_00141a72;
              }
            }
            else {
              iVar3 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar3 < 0) {
LAB_00141934:
                fmt = "Invalid symbol";
                goto LAB_00141a72;
              }
              if (iVar3 == *(int *)((long)pvVar1 + 0x3d4)) {
                iVar4 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar4 < 0) goto LAB_00141934;
                switch(iVar4) {
                case 0:
                  *(undefined1 *)((long)pvVar1 + 0x388) = 1;
                  uVar6 = read_data_compressed(a,buff,size,offset,local_50);
                  uVar12 = (ulong)uVar6;
                  goto LAB_00141a83;
                default:
                  goto switchD_001413bf_caseD_1;
                case 2:
                  *(undefined1 *)((long)pvVar1 + 0x3d1) = 1;
                  goto LAB_0014188e;
                case 3:
                  archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
                  uVar12 = 0xffffffe7;
                  goto LAB_00141a83;
                case 4:
                  uVar6 = 0;
                  iVar3 = 0x10;
                  do {
                    iVar4 = Ppmd7_DecodeSymbol(p,rc);
                    if (iVar4 < 0) goto LAB_00141934;
                    uVar6 = uVar6 | iVar4 << ((byte)iVar3 & 0x1f);
                    iVar3 = iVar3 + -8;
                  } while (iVar3 != -8);
                  iVar3 = Ppmd7_DecodeSymbol(p,rc);
                  if (iVar3 < 0) goto LAB_00141934;
                  uVar19 = iVar3 + 0x20;
                  uVar13 = *(uint *)((long)pvVar1 + 0x358);
                  uVar5 = *(uint *)((long)pvVar1 + 0x360) & uVar13;
                  uVar21 = (uVar5 - uVar6) - 2 & uVar13;
                  uVar6 = uVar19;
                  do {
                    uVar14 = uVar21;
                    if ((int)uVar21 < (int)uVar5) {
                      uVar14 = uVar5;
                    }
                    uVar14 = (uVar13 - uVar14) + 1;
                    if ((int)uVar6 < (int)uVar14) {
                      uVar14 = uVar6;
                    }
                    pvVar9 = (void *)((long)(int)uVar5 + *(long *)((long)pvVar1 + 0x350));
                    pvVar8 = (void *)(*(long *)((long)pvVar1 + 0x350) + (long)(int)uVar21);
                    if (((int)(uVar14 + uVar5) < (int)uVar21) ||
                       ((int)(uVar14 + uVar21) < (int)uVar5)) {
                      memcpy(pvVar9,pvVar8,(long)(int)uVar14);
                    }
                    else if (0 < (int)uVar14) {
                      uVar12 = 0;
                      do {
                        *(undefined1 *)((long)pvVar9 + uVar12) =
                             *(undefined1 *)((long)pvVar8 + uVar12);
                        uVar12 = uVar12 + 1;
                      } while (uVar14 != uVar12);
                    }
                    uVar13 = *(uint *)((long)pvVar1 + 0x358);
                    uVar5 = uVar14 + uVar5 & uVar13;
                    uVar21 = uVar14 + uVar21 & uVar13;
                    uVar16 = uVar6 - uVar14;
                    bVar2 = (int)uVar14 <= (int)uVar6;
                    uVar6 = uVar16;
                  } while (uVar16 != 0 && bVar2);
                  break;
                case 5:
                  iVar3 = Ppmd7_DecodeSymbol(p,rc);
                  if (iVar3 < 0) goto LAB_00141934;
                  uVar19 = iVar3 + 4;
                  uVar6 = *(uint *)((long)pvVar1 + 0x358);
                  uVar5 = *(uint *)((long)pvVar1 + 0x360) & uVar6;
                  uVar21 = uVar5 - 1 & uVar6;
                  uVar13 = uVar19;
                  do {
                    uVar14 = uVar21;
                    if ((int)uVar21 < (int)uVar5) {
                      uVar14 = uVar5;
                    }
                    uVar14 = (uVar6 - uVar14) + 1;
                    if ((int)uVar13 < (int)uVar14) {
                      uVar14 = uVar13;
                    }
                    pvVar9 = (void *)((long)(int)uVar5 + *(long *)((long)pvVar1 + 0x350));
                    pvVar8 = (void *)(*(long *)((long)pvVar1 + 0x350) + (long)(int)uVar21);
                    if (((int)(uVar14 + uVar5) < (int)uVar21) ||
                       ((int)(uVar14 + uVar21) < (int)uVar5)) {
                      memcpy(pvVar9,pvVar8,(long)(int)uVar14);
                    }
                    else if (0 < (int)uVar14) {
                      uVar12 = 0;
                      do {
                        *(undefined1 *)((long)pvVar9 + uVar12) =
                             *(undefined1 *)((long)pvVar8 + uVar12);
                        uVar12 = uVar12 + 1;
                      } while (uVar14 != uVar12);
                    }
                    uVar6 = *(uint *)((long)pvVar1 + 0x358);
                    uVar5 = uVar14 + uVar5 & uVar6;
                    uVar21 = uVar14 + uVar21 & uVar6;
                    uVar16 = uVar13 - uVar14;
                    bVar2 = (int)uVar14 <= (int)uVar13;
                    uVar13 = uVar16;
                  } while (uVar16 != 0 && bVar2);
                }
                uVar12 = (ulong)uVar19;
                lVar15 = *(long *)((long)pvVar1 + 0x360) + uVar12;
              }
              else {
switchD_001413bf_caseD_1:
                *(char *)(*(long *)((long)pvVar1 + 0x350) +
                         (long)(int)(*(uint *)((long)pvVar1 + 0x358) &
                                    *(uint *)((long)pvVar1 + 0x360))) = (char)iVar3;
                lVar15 = *(long *)((long)pvVar1 + 0x360) + 1;
                uVar12 = 1;
              }
              *(long *)((long)pvVar1 + 0x360) = lVar15;
              sVar10 = uVar12 + *(long *)((long)pvVar1 + 0xb0);
              *(size_t *)((long)pvVar1 + 0xb0) = sVar10;
            }
            uVar17 = (ulong)(uint)(*(int *)((long)pvVar1 + 0xd8) - *(int *)((long)pvVar1 + 0xd4));
            if ((long)sVar10 < (long)uVar17) {
              uVar17 = sVar10;
            }
            uVar6 = copy_from_lzss_window_to_unp(a,buff,*(int64_t *)((long)pvVar1 + 0xb8),uVar17);
            uVar12 = (ulong)uVar6;
            if (uVar6 != 0) goto LAB_00141a83;
            *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + uVar17;
            *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) - uVar17;
            uVar12 = 0;
          }
LAB_0014188e:
          pvVar8 = *buff;
          if (pvVar8 != (void *)0x0) {
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
            *size = (ulong)*(uint *)((long)pvVar1 + 0xd8);
            goto LAB_0014198e;
          }
        }
        else {
          if (*(long *)((long)pvVar1 + 0x28) <= *(long *)((long)pvVar1 + 0xb8)) goto LAB_001418ad;
          if ((*(char *)((long)pvVar1 + 0x3d2) != '\0') ||
             (uVar17 = *(ulong *)((long)pvVar1 + 0xb0), (long)uVar17 < 1)) goto LAB_00141259;
          length = (ulong)(uint)(*(int *)((long)pvVar1 + 0xd8) - *(int *)((long)pvVar1 + 0xd4));
          if (uVar17 < length) {
            length = uVar17;
          }
          uVar6 = copy_from_lzss_window_to_unp(a,buff,*(long *)((long)pvVar1 + 0xb8),length);
          uVar12 = (ulong)uVar6;
          if (uVar6 != 0) goto LAB_00141a83;
          *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + length;
          *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) - length;
          pvVar8 = *buff;
          uVar12 = 0;
          if (pvVar8 != (void *)0x0) {
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
            *size = (ulong)*(uint *)((long)pvVar1 + 0xd8);
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
            uVar11 = crc32(*(undefined8 *)((long)pvVar1 + 0xf0),pvVar8,(int)*size);
            *(undefined8 *)((long)pvVar1 + 0xf0) = uVar11;
            goto LAB_00141900;
          }
        }
      } while (*(char *)((long)pvVar1 + 0xd0) != '\0');
    }
LAB_00141a7e:
    uVar12 = 0xffffffe2;
LAB_00141a83:
    iVar3 = (int)uVar12;
  }
  return iVar3;
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
                     int64_t *offset, size_t looper)
{
  if (looper++ > MAX_COMPRESS_DEPTH)
    return (ARCHIVE_FATAL);

  struct rar *rar;
  int64_t start, end;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);

    if (rar->filters.bytes_ready > 0)
    {
      /* Flush unp_buffer first */
      if (rar->unp_offset > 0)
      {
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        rar->unp_offset = 0;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
      }
      else
      {
        *buff = rar->filters.bytes;
        *size = rar->filters.bytes_ready;

        rar->offset += *size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;

        rar->filters.bytes_ready -= *size;
        rar->filters.bytes += *size;
      }
      goto ending_block;
    }

    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (rar->filters.lastend == rar->filters.filterstart)
    {
      if (!run_filters(a))
        return (ARCHIVE_FATAL);
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset, looper);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;

      /* We don't want to overflow the window and overwrite data that we write
       * at 'start'. Therefore, reduce the end length by the maximum match size,
       * which is 260 bytes. You can compute this maximum by looking at the
       * definition of 'expand', in particular when 'symbol >= 271'. */
      /* NOTE: It's possible for 'dictionary_size' to be less than this 260
       * value, however that will only be the case when 'unp_size' is small,
       * which should only happen when the entry size is small and there's no
       * risk of overflowing the buffer */
      if (rar->dictionary_size > 260) {
        end -= 260;
      }

      if (rar->filters.filterstart < end) {
        end = rar->filters.filterstart;
      }

      ret = expand(a, &end);
      if (ret != ARCHIVE_OK)
	      return (ret);

      rar->bytes_uncopied = end - start;
      rar->filters.lastend = end;
      if (rar->filters.lastend != rar->filters.filterstart && rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
ending_block:
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}